

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 ProcessScript(jx9 *pEngine,jx9_vm **ppVm,SyString *pScript,sxi32 iFlags,char *zFilePath)

{
  SySet *pSet;
  SyHash *pHash;
  GenBlock *pGVar1;
  undefined8 *puVar2;
  sxu32 sVar3;
  uint uVar4;
  void *pvVar5;
  ProcConsumer p_Var6;
  GenBlock *pGVar7;
  sxi32 sVar8;
  int iVar9;
  jx9_vm *pVm;
  GenBlock *pGVar10;
  jx9_value *pjVar11;
  undefined4 in_register_0000000c;
  ProcCmp zPath;
  ProcCmp p_Var12;
  char *pcVar13;
  sxi32 extraout_EDX;
  ProcHash xHash;
  ProcHash xHash_00;
  ProcHash xHash_01;
  ProcHash xHash_02;
  void *pUserData;
  ProcHash xHash_03;
  ProcHash xHash_04;
  undefined8 extraout_RDX;
  undefined8 uVar14;
  undefined8 extraout_RDX_00;
  long lVar15;
  jx9_vm *pjVar16;
  GenBlock *pGVar17;
  ulong uVar18;
  bool bVar19;
  SyString local_40;
  
  iVar9 = (int)zFilePath;
  zPath = (ProcCmp)CONCAT44(in_register_0000000c,iFlags);
  p_Var12 = zPath;
  pVm = (jx9_vm *)SyMemBackendPoolAlloc(&pEngine->sAllocator,0x6e8);
  if (pVm == (jx9_vm *)0x0) {
    sVar8 = -1;
LAB_00123170:
    if (ppVm == (jx9_vm **)0x0) {
      return sVar8;
    }
  }
  else {
    memset(pVm,0,0x6e8);
    pVm->pEngine = pEngine;
    SyMemBackendInitFromParent((SyMemBackend *)pVm,&pEngine->sAllocator);
    (pVm->aByteCode).nUsed = 0;
    (pVm->aByteCode).nSize = 0;
    (pVm->aByteCode).eSize = 0x18;
    (pVm->aByteCode).nCursor = 0;
    (pVm->aByteCode).pAllocator = (SyMemBackend *)pVm;
    (pVm->aByteCode).pBase = (void *)0x0;
    (pVm->aByteCode).pUserData = (void *)0x0;
    SySetAlloc(&pVm->aByteCode,0xff);
    pVm->pByteContainer = &pVm->aByteCode;
    (pVm->aMemObj).nUsed = 0;
    (pVm->aMemObj).nSize = 0;
    (pVm->aMemObj).eSize = 0x40;
    (pVm->aMemObj).nCursor = 0;
    (pVm->aMemObj).pAllocator = (SyMemBackend *)pVm;
    (pVm->aMemObj).pBase = (void *)0x0;
    (pVm->aMemObj).pUserData = (void *)0x0;
    SySetAlloc(&pVm->aMemObj,0xff);
    (pVm->sConsumer).pBlob = (void *)0x0;
    (pVm->sConsumer).nByte = 0;
    (pVm->sConsumer).mByte = 0;
    (pVm->sConsumer).pAllocator = (SyMemBackend *)pVm;
    (pVm->sConsumer).nFlags = 0;
    (pVm->sWorker).pBlob = (void *)0x0;
    (pVm->sWorker).nByte = 0;
    (pVm->sWorker).mByte = 0;
    (pVm->sWorker).pAllocator = (SyMemBackend *)pVm;
    (pVm->sWorker).nFlags = 0;
    (pVm->sArgv).pBlob = (void *)0x0;
    (pVm->sArgv).nByte = 0;
    (pVm->sArgv).mByte = 0;
    (pVm->sArgv).pAllocator = (SyMemBackend *)pVm;
    (pVm->sArgv).nFlags = 0;
    pSet = &pVm->aLitObj;
    (pVm->aLitObj).nUsed = 0;
    (pVm->aLitObj).nSize = 0;
    (pVm->aLitObj).eSize = 0x40;
    (pVm->aLitObj).nCursor = 0;
    (pVm->aLitObj).pAllocator = (SyMemBackend *)pVm;
    (pVm->aLitObj).pBase = (void *)0x0;
    (pVm->aLitObj).pUserData = (void *)0x0;
    SySetAlloc(pSet,0xff);
    SyHashInit(&pVm->hHostFunction,(SyMemBackend *)pVm,xHash,p_Var12);
    SyHashInit(&pVm->hFunction,(SyMemBackend *)pVm,xHash_00,p_Var12);
    SyHashInit(&pVm->hConstant,(SyMemBackend *)pVm,xHash_01,p_Var12);
    pjVar16 = pVm;
    SyHashInit(&pVm->hSuper,(SyMemBackend *)pVm,xHash_02,p_Var12);
    (pVm->aFreeObj).nUsed = 0;
    (pVm->aFreeObj).nSize = 0;
    (pVm->aFreeObj).eSize = 0x10;
    (pVm->aFreeObj).nCursor = 0;
    (pVm->aFreeObj).pAllocator = (SyMemBackend *)pVm;
    (pVm->aFreeObj).pBase = (void *)0x0;
    (pVm->aFreeObj).pUserData = (void *)0x0;
    (pVm->aFiles).nUsed = 0;
    (pVm->aFiles).nSize = 0;
    (pVm->aFiles).eSize = 0x10;
    (pVm->aFiles).nCursor = 0;
    (pVm->aFiles).pAllocator = (SyMemBackend *)pVm;
    (pVm->aFiles).pBase = (void *)0x0;
    (pVm->aFiles).pUserData = (void *)0x0;
    (pVm->aPaths).nUsed = 0;
    (pVm->aPaths).nSize = 0;
    (pVm->aPaths).eSize = 0x10;
    (pVm->aPaths).nCursor = 0;
    (pVm->aPaths).pAllocator = (SyMemBackend *)pVm;
    (pVm->aPaths).pBase = (void *)0x0;
    (pVm->aPaths).pUserData = (void *)0x0;
    (pVm->aIncluded).nUsed = 0;
    (pVm->aIncluded).nSize = 0;
    (pVm->aIncluded).eSize = 0x10;
    (pVm->aIncluded).nCursor = 0;
    (pVm->aIncluded).pAllocator = (SyMemBackend *)pVm;
    (pVm->aIncluded).pBase = (void *)0x0;
    (pVm->aIncluded).pUserData = (void *)0x0;
    (pVm->aIOstream).nUsed = 0;
    (pVm->aIOstream).nSize = 0;
    (pVm->aIOstream).eSize = 8;
    (pVm->aIOstream).nCursor = 0;
    (pVm->aIOstream).pAllocator = (SyMemBackend *)pVm;
    (pVm->aIOstream).pBase = (void *)0x0;
    (pVm->aIOstream).pUserData = (void *)0x0;
    (pVm->sAssertCallback).pVm = (jx9_vm *)0x0;
    (pVm->sAssertCallback).sBlob.pAllocator = (SyMemBackend *)0x0;
    (pVm->sAssertCallback).x.rVal = 0.0;
    *(undefined8 *)&(pVm->sAssertCallback).iFlags = 0;
    *(undefined8 *)&(pVm->sAssertCallback).sBlob.nFlags = 0;
    *(undefined8 *)&(pVm->sAssertCallback).nIdx = 0;
    (pVm->sAssertCallback).sBlob.pBlob = (void *)0x0;
    (pVm->sAssertCallback).sBlob.nByte = 0;
    (pVm->sAssertCallback).sBlob.mByte = 0;
    (pVm->sAssertCallback).pVm = pVm;
    (pVm->sAssertCallback).sBlob.pAllocator = (SyMemBackend *)pVm;
    (pVm->sAssertCallback).iFlags = 0x20;
    pVm->nMaxDepth = 0x20;
    pVm->iAssertFlags = 2;
    SyRandomnessInit(&pVm->sPrng,(ProcRandomSeed)pjVar16,pUserData);
    sVar8 = SySetPut(pSet,"");
    if (((sVar8 != 0) || (sVar3 = (pVm->aLitObj).nUsed, sVar3 == 0)) ||
       (pvVar5 = (pVm->aLitObj).pBase, pvVar5 == (void *)0x0)) {
LAB_00123151:
      SyMemBackendRelease((SyMemBackend *)pVm);
      SyMemBackendPoolFree(&pEngine->sAllocator,pVm);
      sVar8 = -0x47;
      goto LAB_00123170;
    }
    uVar18 = (ulong)((sVar3 - 1) * (pVm->aLitObj).eSize);
    puVar2 = (undefined8 *)((long)pvVar5 + uVar18 + 0x10);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)pvVar5 + uVar18) = 0;
    ((undefined8 *)((long)pvVar5 + uVar18))[1] = 0;
    puVar2 = (undefined8 *)((long)pvVar5 + uVar18 + 0x30);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)((long)pvVar5 + uVar18 + 0x20);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(jx9_vm **)((long)pvVar5 + uVar18 + 0x10) = pVm;
    *(jx9_vm **)((long)pvVar5 + uVar18 + 0x18) = pVm;
    *(undefined4 *)((long)pvVar5 + uVar18 + 8) = 0x20;
    sVar8 = SySetPut(pSet,"");
    if (((sVar8 != 0) || (sVar3 = (pVm->aLitObj).nUsed, sVar3 == 0)) ||
       (pvVar5 = (pVm->aLitObj).pBase, pvVar5 == (void *)0x0)) goto LAB_00123151;
    uVar18 = (ulong)((sVar3 - 1) * (pVm->aLitObj).eSize);
    puVar2 = (undefined8 *)((long)pvVar5 + uVar18 + 0xc);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)((long)pvVar5 + uVar18 + 0x2c);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)((long)pvVar5 + uVar18 + 0x1c);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined4 *)((long)pvVar5 + uVar18 + 0x3c) = 0;
    *(jx9_vm **)((long)pvVar5 + uVar18 + 0x10) = pVm;
    puVar2 = (undefined8 *)((long)pvVar5 + uVar18 + 0x20);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(jx9_vm **)((long)pvVar5 + uVar18 + 0x18) = pVm;
    *(undefined8 *)((long)pvVar5 + uVar18) = 1;
    *(undefined4 *)((long)pvVar5 + uVar18 + 8) = 8;
    sVar8 = SySetPut(pSet,"");
    if (((sVar8 != 0) || (sVar3 = (pVm->aLitObj).nUsed, sVar3 == 0)) ||
       (p_Var12 = (ProcCmp)(pVm->aLitObj).pBase, p_Var12 == (ProcCmp)0x0)) goto LAB_00123151;
    uVar18 = (ulong)((sVar3 - 1) * (pVm->aLitObj).eSize);
    *(undefined8 *)(p_Var12 + uVar18 + 0xc) = 0;
    *(undefined8 *)(p_Var12 + uVar18 + 0xc + 8) = 0;
    *(undefined8 *)(p_Var12 + uVar18 + 0x2c) = 0;
    *(undefined8 *)(p_Var12 + uVar18 + 0x2c + 8) = 0;
    *(undefined8 *)(p_Var12 + uVar18 + 0x1c) = 0;
    *(undefined8 *)(p_Var12 + uVar18 + 0x1c + 8) = 0;
    *(undefined4 *)(p_Var12 + uVar18 + 0x3c) = 0;
    *(jx9_vm **)(p_Var12 + uVar18 + 0x10) = pVm;
    *(undefined8 *)(p_Var12 + uVar18 + 0x20) = 0;
    *(undefined8 *)(p_Var12 + uVar18 + 0x20 + 8) = 0;
    *(jx9_vm **)(p_Var12 + uVar18 + 0x18) = pVm;
    *(undefined8 *)(p_Var12 + uVar18) = 0;
    *(undefined4 *)(p_Var12 + uVar18 + 8) = 8;
    sVar8 = VmEnterFrame(pVm,(void *)0x0,(VmFrame **)0x0);
    if (sVar8 != 0) goto LAB_00123151;
    pHash = &(pVm->sCodeGen).hLiteral;
    p_Var6 = (pEngine->xConf).xErr;
    pvVar5 = (pEngine->xConf).pErrData;
    memset(pHash,0,0x168);
    (pVm->sCodeGen).pVm = pVm;
    (pVm->sCodeGen).xErr = p_Var6;
    (pVm->sCodeGen).pErrData = pvVar5;
    SyHashInit(pHash,(SyMemBackend *)pVm,xHash_03,p_Var12);
    SyHashInit(&(pVm->sCodeGen).hVar,(SyMemBackend *)pVm,xHash_04,p_Var12);
    pGVar1 = &(pVm->sCodeGen).sGlobal;
    (pVm->sCodeGen).sGlobal.nFirstInstr = pVm->pByteContainer->nUsed;
    (pVm->sCodeGen).sGlobal.pGen = &pVm->sCodeGen;
    (pVm->sCodeGen).sGlobal.iFlags = 0x10;
    (pVm->sCodeGen).sGlobal.pParent = (GenBlock *)0x0;
    (pVm->sCodeGen).sGlobal.bPostContinue = '\0';
    pjVar16 = (pVm->sCodeGen).pVm;
    (pVm->sCodeGen).sGlobal.aJumpFix.nUsed = 0;
    (pVm->sCodeGen).sGlobal.aJumpFix.nSize = 0;
    (pVm->sCodeGen).sGlobal.aJumpFix.eSize = 8;
    (pVm->sCodeGen).sGlobal.aJumpFix.nCursor = 0;
    (pVm->sCodeGen).sGlobal.aJumpFix.pAllocator = &pjVar16->sAllocator;
    (pVm->sCodeGen).sGlobal.aJumpFix.pBase = (void *)0x0;
    (pVm->sCodeGen).sGlobal.aJumpFix.pUserData = (void *)0x0;
    (pVm->sCodeGen).sGlobal.pUserData = (void *)0x0;
    (pVm->sCodeGen).sGlobal.aPostContFix.nUsed = 0;
    (pVm->sCodeGen).sGlobal.aPostContFix.nSize = 0;
    (pVm->sCodeGen).sGlobal.aPostContFix.eSize = 8;
    (pVm->sCodeGen).sGlobal.aPostContFix.nCursor = 0;
    (pVm->sCodeGen).sGlobal.aPostContFix.pAllocator = &pjVar16->sAllocator;
    (pVm->sCodeGen).sGlobal.aPostContFix.pBase = (void *)0x0;
    (pVm->sCodeGen).sGlobal.aPostContFix.pUserData = (void *)0x0;
    (pVm->sCodeGen).pCurrent = pGVar1;
    pVm->nMagic = 0xea12cd72;
    local_40.zString =
         "function scandir(string $directory, int $sort_order = SCANDIR_SORT_ASCENDING){  if( func_num_args() < 1 ){ return FALSE; }  $aDir = [];  $pHandle = opendir($directory);  if( $pHandle == FALSE ){ return FALSE; }  while(FALSE !== ($pEntry = readdir($pHandle)) ){      $aDir[] = $pEntry;   }  closedir($pHandle);  if( $sort_order == SCANDIR_SORT_DESCENDING ){      rsort($aDir);  }else if( $sort_order == SCANDIR_SORT_ASCENDING ){      sort($aDir);  }  return $aDir;}function glob(string $pattern, int $iFlags = 0){/* Open the target directory */$zDir = dirname($pattern);if(!is_string($zDir) ){ $zDir = \'./\'; }$pHandle = opendir($zDir);if( $pHandle == FALSE ){   /* IO error while opening the current directory, return FALSE */\treturn FALSE;}$pattern = basename($pattern);$pArray = []; /* Empty array *//* Loop throw available entries */while( FALSE !== ($pEntry = readdir($pHandle)) ){ /* Use the built-in strglob function which is a Symisc eXtension for wildcard comparison*/\t$rc = strglob($pattern, $pEntry);\tif( $rc ){\t   if( is_dir($pEntry) ){\t      if( $iFlags & GLOB_MARK ){\t\t     /* Adds a slash to each directory returned */\t\t\t $pEntry .= DIRECTORY_SEPARATOR;\t\t  }\t   }else if( $iFlags & GLOB_ONLYDIR ){\t     /* Not a directory, ignore */\t\t continue;\t   }\t   /* Add the entry */\t   $pArray[] = $pEntry;\t} }/* Close the handle */closedir($pHandle);if( ($iFlags & GLOB_NOSORT) == 0 ){  /* Sort the array */  sort($pArray);}if( ($iFlags & GLOB_NOCHECK) && sizeof($pArray) < 1 ){  /* Return the search pattern if no files matching were found */  $pArray[] = $pattern;}/* Return the created array */return $pArray;}/* Creates a temporary file */function tmpfile(){  /* Extract the temp directory */  $zTempDir = sys_get_temp_dir();  if( strlen($zTempDir) < 1 ){    /* Use the current dir */    $zTempDir = \'.\';  }  /* Create the file */  $pHandle = fopen($zTempDir.DIRECTORY_SEPARATOR.\'JX9\'.rand_str(12), \'w+\');  return $pHandle;}/* Creates a temporary filename */function tempnam(string $zDir = sys_get_temp_dir() /* Symisc eXtension */, string ..." /* TRUNCATED STRING LITERAL */
    ;
    local_40.nByte = 0xc46;
    VmEvalChunk(pVm,(jx9_context *)0x0,&local_40,0,iVar9);
    p_Var6 = (pEngine->xConf).xErr;
    pvVar5 = (pEngine->xConf).pErrData;
    pGVar17 = (pVm->sCodeGen).pCurrent;
    pGVar7 = pGVar17->pParent;
    uVar14 = extraout_RDX;
    while (pGVar10 = pGVar7, sVar8 = (sxi32)uVar14, pGVar10 != (GenBlock *)0x0) {
      GenStateFreeBlock(pGVar17);
      uVar14 = extraout_RDX_00;
      pGVar17 = pGVar10;
      pGVar7 = pGVar10->pParent;
    }
    (pVm->sCodeGen).xErr = p_Var6;
    (pVm->sCodeGen).pErrData = pvVar5;
    (pVm->sCodeGen).pCurrent = pGVar1;
    (pVm->sCodeGen).pIn = (SyToken *)0x0;
    (pVm->sCodeGen).pEnd = (SyToken *)0x0;
    (pVm->sCodeGen).nErr = 0;
    if (zPath != (ProcCmp)0x0) {
      jx9VmPushFilePath(pVm,(char *)zPath,-1,'\x01',(sxi32 *)0x0);
      sVar8 = extraout_EDX;
    }
    (pEngine->xConf).sErrConsumer.nByte = 0;
    uVar4 = (pEngine->xConf).sErrConsumer.nFlags;
    if ((uVar4 & 4) != 0) {
      (pEngine->xConf).sErrConsumer.pBlob = (void *)0x0;
      (pEngine->xConf).sErrConsumer.mByte = 0;
      (pEngine->xConf).sErrConsumer.nFlags = uVar4 & 0xfffffffb;
    }
    jx9CompileScript(pVm,pScript,sVar8);
    if ((pVm->sCodeGen).nErr != 0) {
      SyMemBackendRelease((SyMemBackend *)pVm);
      SyMemBackendPoolFree(&pEngine->sAllocator,pVm);
      sVar8 = -0x46;
      goto LAB_00123170;
    }
    if (pVm->nMagic == 0xea12cd72) {
      pVm->nMagic = 0xba851227;
      pGVar17 = (pVm->sCodeGen).pCurrent;
      pGVar7 = pGVar17->pParent;
      while (pGVar10 = pGVar7, pGVar10 != (GenBlock *)0x0) {
        GenStateFreeBlock(pGVar17);
        pGVar17 = pGVar10;
        pGVar7 = pGVar10->pParent;
      }
      (pVm->sCodeGen).xErr = (ProcConsumer)0x0;
      (pVm->sCodeGen).pErrData = (void *)0x0;
      (pVm->sCodeGen).pCurrent = pGVar1;
      (pVm->sCodeGen).pIn = (SyToken *)0x0;
      (pVm->sCodeGen).pEnd = (SyToken *)0x0;
      (pVm->sCodeGen).nErr = 0;
      sVar8 = jx9VmEmitInstr(pVm,1,0,0,(void *)0x0,(sxu32 *)0x0);
      if (sVar8 == 0) {
        (pVm->sExec).pVm = (jx9_vm *)0x0;
        (pVm->sExec).sBlob.pAllocator = (SyMemBackend *)0x0;
        (pVm->sExec).x.rVal = 0.0;
        *(undefined8 *)&(pVm->sExec).iFlags = 0;
        *(undefined8 *)&(pVm->sExec).sBlob.nFlags = 0;
        *(undefined8 *)&(pVm->sExec).nIdx = 0;
        (pVm->sExec).pVm = pVm;
        (pVm->sExec).sBlob.pBlob = (void *)0x0;
        (pVm->sExec).sBlob.nByte = 0;
        (pVm->sExec).sBlob.mByte = 0;
        (pVm->sExec).sBlob.pAllocator = (SyMemBackend *)pVm;
        (pVm->sExec).iFlags = 0x20;
        pjVar11 = VmNewOperandStack(pVm,pVm->pByteContainer->nUsed);
        pVm->aOps = pjVar11;
        if (pjVar11 != (jx9_value *)0x0) {
          (pVm->sVmConsumer).xConsumer = jx9VmBlobConsumer;
          (pVm->sVmConsumer).pUserData = &pVm->sConsumer;
          lVar15 = 8;
          do {
            iVar9 = jx9_create_function(pVm,*(char **)((long)&sFCallOp.iAssoc + lVar15),
                                        *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                                         ((long)&aVmFunc[0].zName + lVar15),pVm);
            if (iVar9 != 0) break;
            bVar19 = lVar15 != 0x1d8;
            lVar15 = lVar15 + 0x10;
          } while (bVar19);
          if (iVar9 == 0) {
            lVar15 = 0;
            do {
              pjVar11 = jx9_new_array(pVm);
              if ((pjVar11 == (jx9_value *)0x0) ||
                 (iVar9 = jx9_vm_config(pVm,6,(long)&jx9HashmapLoadBuiltin_azSuper_rel +
                                              (long)*(int *)((long)&
                                                  jx9HashmapLoadBuiltin_azSuper_rel + lVar15),
                                        pjVar11), iVar9 != 0)) goto LAB_00123560;
              jx9_release_value(pVm,pjVar11);
              lVar15 = lVar15 + 4;
            } while (lVar15 != 0x24);
            sVar3 = (pVm->aFiles).nUsed;
            uVar18 = 8;
            pcVar13 = ":Memory:";
            if ((sVar3 != 0) && (pvVar5 = (pVm->aFiles).pBase, pvVar5 != (void *)0x0)) {
              uVar18 = (ulong)((sVar3 - 1) * (pVm->aFiles).eSize);
              pcVar13 = *(char **)((long)pvVar5 + uVar18);
              uVar18 = (ulong)*(uint *)((long)pvVar5 + uVar18 + 8);
            }
            sVar8 = 0;
            jx9_vm_config(pVm,8,"SCRIPT_FILENAME",pcVar13,uVar18);
            jx9RegisterBuiltInConstant(pVm);
            jx9RegisterBuiltInFunction(pVm);
            jx9_vm_config(pVm,2,"./");
            pjVar16 = pEngine->pVms;
            if (pjVar16 != (jx9_vm *)0x0) {
              pVm->pNext = pjVar16;
              pjVar16->pPrev = pVm;
            }
            pEngine->pVms = pVm;
            pEngine->iVm = pEngine->iVm + 1;
            goto LAB_00123178;
          }
        }
      }
    }
LAB_00123560:
    SyMemBackendRelease((SyMemBackend *)pVm);
    SyMemBackendPoolFree(&pEngine->sAllocator,pVm);
    sVar8 = -0x47;
  }
  pVm = (jx9_vm *)0x0;
LAB_00123178:
  *ppVm = pVm;
  return sVar8;
}

Assistant:

static sxi32 ProcessScript(
	jx9 *pEngine,          /* Running JX9 engine */
	jx9_vm **ppVm,         /* OUT: A pointer to the virtual machine */
	SyString *pScript,     /* Raw JX9 script to compile */
	sxi32 iFlags,          /* Compile-time flags */
	const char *zFilePath  /* File path if script come from a file. NULL otherwise */
	)
{
	jx9_vm *pVm;
	int rc;
	/* Allocate a new virtual machine */
	pVm = (jx9_vm *)SyMemBackendPoolAlloc(&pEngine->sAllocator, sizeof(jx9_vm));
	if( pVm == 0 ){
		/* If the supplied memory subsystem is so sick that we are unable to allocate
		 * a tiny chunk of memory, there is no much we can do here. */
		if( ppVm ){
			*ppVm = 0;
		}
		return JX9_NOMEM;
	}
	if( iFlags < 0 ){
		/* Default compile-time flags */
		iFlags = 0;
	}
	/* Initialize the Virtual Machine */
	rc = jx9VmInit(pVm, &(*pEngine));
	if( rc != JX9_OK ){
		SyMemBackendPoolFree(&pEngine->sAllocator, pVm);
		if( ppVm ){
			*ppVm = 0;
		}
		return JX9_VM_ERR;
	}
	if( zFilePath ){
		/* Push processed file path */
		jx9VmPushFilePath(pVm, zFilePath, -1, TRUE, 0);
	}
	/* Reset the error message consumer */
	SyBlobReset(&pEngine->xConf.sErrConsumer);
	/* Compile the script */
	jx9CompileScript(pVm, &(*pScript), iFlags);
	if( pVm->sCodeGen.nErr > 0 || pVm == 0){
		sxu32 nErr = pVm->sCodeGen.nErr;
		/* Compilation error or null ppVm pointer, release this VM */
		SyMemBackendRelease(&pVm->sAllocator);
		SyMemBackendPoolFree(&pEngine->sAllocator, pVm);
		if( ppVm ){
			*ppVm = 0;
		}
		return nErr > 0 ? JX9_COMPILE_ERR : JX9_OK;
	}
	/* Prepare the virtual machine for bytecode execution */
	rc = jx9VmMakeReady(pVm);
	if( rc != JX9_OK ){
		goto Release;
	}
	/* Install local import path which is the current directory */
	jx9_vm_config(pVm, JX9_VM_CONFIG_IMPORT_PATH, "./");
#if defined(JX9_ENABLE_THREADS)
	if( sJx9MPGlobal.nThreadingLevel > JX9_THREAD_LEVEL_SINGLE ){
		 /* Associate a recursive mutex with this instance */
		 pVm->pMutex = SyMutexNew(sJx9MPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pVm->pMutex == 0 ){
			 goto Release;
		 }
	 }
#endif
	/* Script successfully compiled, link to the list of active virtual machines */
	MACRO_LD_PUSH(pEngine->pVms, pVm);
	pEngine->iVm++;
	/* Point to the freshly created VM */
	*ppVm = pVm;
	/* Ready to execute JX9 bytecode */
	return JX9_OK;
Release:
	SyMemBackendRelease(&pVm->sAllocator);
	SyMemBackendPoolFree(&pEngine->sAllocator, pVm);
	*ppVm = 0;
	return JX9_VM_ERR;
}